

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_self(FuncState *fs,expdesc *e,expdesc *key)

{
  int b;
  int a;
  int c;
  
  luaK_exp2anyreg(fs,e);
  b = (e->u).info;
  freeexp(fs,e);
  *(uint *)&e->u = (uint)fs->freereg;
  e->k = VNONRELOC;
  luaK_reserveregs(fs,2);
  a = (e->u).info;
  c = luaK_exp2RK(fs,key);
  luaK_codeABC(fs,OP_SELF,a,b,c);
  freeexp(fs,key);
  return;
}

Assistant:

void luaK_self(FuncState *fs, expdesc *e, expdesc *key) {
    int ereg;
    luaK_exp2anyreg(fs, e);
    ereg = e->u.info;  /* register where 'e' was placed */
    freeexp(fs, e);
    e->u.info = fs->freereg;  /* base register for op_self */
    e->k = VNONRELOC;  /* self expression has a fixed register */
    luaK_reserveregs(fs, 2);  /* function and 'self' produced by op_self */
    luaK_codeABC(fs, OP_SELF, e->u.info, ereg, luaK_exp2RK(fs, key));
    freeexp(fs, key);
}